

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermSymbol * __thiscall
glslang::TIntermediate::addSymbol(TIntermediate *this,TType *type,TSourceLoc *loc)

{
  TIntermSymbol *pTVar1;
  TConstUnionArray unionArray;
  pool_allocator<char> local_a0;
  pool_allocator<char> local_98;
  TConstUnionArray local_90;
  TString local_80;
  TString local_58;
  
  local_90._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_0089abb8;
  local_90.unionArray = (TConstUnionVector *)0x0;
  local_98.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_80,""
             ,&local_98);
  local_a0.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,""
             ,&local_a0);
  pTVar1 = addSymbol(this,0,&local_80,&local_58,type,&local_90,(TIntermTyped *)0x0,loc);
  return pTVar1;
}

Assistant:

TIntermSymbol* TIntermediate::addSymbol(const TType& type, const TSourceLoc& loc)
{
    TConstUnionArray unionArray;  // just a null constant

    return addSymbol(0, "", "", type, unionArray, nullptr, loc);
}